

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool parser_match_string(VrplibParser *p,char *string)

{
  char *pcVar1;
  char *__s2;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char *__n;
  
  parser_eat_whitespaces(p);
  pcVar1 = p->base;
  __s2 = p->at;
  sVar2 = p->size;
  pcVar4 = (char *)strlen(string);
  __n = pcVar1 + (sVar2 - (long)__s2);
  if (pcVar4 <= pcVar1 + (sVar2 - (long)__s2)) {
    __n = pcVar4;
  }
  iVar3 = strncmp(string,__s2,(size_t)__n);
  if (iVar3 == 0) {
    parser_adv(p,(size_t)__n);
  }
  parser_eat_whitespaces(p);
  return iVar3 == 0;
}

Assistant:

static bool parser_match_string(VrplibParser *p, char *string) {
    parser_eat_whitespaces(p);
    size_t len = MIN(parser_remainder_size(p), strlen(string));
    bool result = (0 == strncmp(string, p->at, len));

    if (result) {
        parser_adv(p, len);
    }
    parser_eat_whitespaces(p);
    return result;
}